

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.cpp
# Opt level: O0

void serialize_model<_IO_FILE*>(IsoForest *model,_IO_FILE **out)

{
  bool bVar1;
  reference this;
  vector<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>
  *in_RDI;
  IsoTree *node;
  const_iterator __end2;
  const_iterator __begin2;
  vector<IsoTree,_std::allocator<IsoTree>_> *__range2;
  vector<IsoTree,_std::allocator<IsoTree>_> *tree;
  const_iterator __end1;
  const_iterator __begin1;
  vector<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>
  *__range1;
  size_t veclen;
  size_t data_sizets [2];
  double data_doubles [2];
  uint8_t data_en [5];
  vector<IsoTree,_std::allocator<IsoTree>_> *in_stack_ffffffffffffff78;
  reference in_stack_ffffffffffffff80;
  const_iterator in_stack_ffffffffffffff88;
  const_iterator in_stack_ffffffffffffff90;
  __normal_iterator<const_std::vector<IsoTree,_std::allocator<IsoTree>_>_*,_std::vector<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>_>
  local_50 [2];
  size_type local_40;
  pointer local_38;
  size_type local_30;
  pointer out_00;
  IsoTree *node_00;
  
  if (!interrupt_switch) {
    write_bytes<unsigned_char>
              (in_stack_ffffffffffffff90._M_current,(size_t)in_stack_ffffffffffffff88._M_current,
               (FILE **)in_stack_ffffffffffffff80);
    out_00 = in_RDI[1].
             super__Vector_base<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
    node_00 = (IsoTree *)
              in_RDI[2].
              super__Vector_base<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    write_bytes<double>(in_stack_ffffffffffffff90._M_current,
                        (size_t)in_stack_ffffffffffffff88._M_current,
                        (FILE **)in_stack_ffffffffffffff80);
    local_38 = in_RDI[2].
               super__Vector_base<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    local_30 = std::
               vector<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>
               ::size(in_RDI);
    write_bytes<unsigned_long>
              (in_stack_ffffffffffffff90._M_current,(size_t)in_stack_ffffffffffffff88._M_current,
               (FILE **)in_stack_ffffffffffffff80);
    local_50[0]._M_current =
         (vector<IsoTree,_std::allocator<IsoTree>_> *)
         std::
         vector<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>
         ::begin((vector<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>
                  *)in_stack_ffffffffffffff78);
    std::
    vector<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>
    ::end((vector<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>
           *)in_stack_ffffffffffffff78);
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<const_std::vector<IsoTree,_std::allocator<IsoTree>_>_*,_std::vector<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>_>
                               *)in_stack_ffffffffffffff80,
                              (__normal_iterator<const_std::vector<IsoTree,_std::allocator<IsoTree>_>_*,_std::vector<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>_>
                               *)in_stack_ffffffffffffff78), bVar1) {
      this = __gnu_cxx::
             __normal_iterator<const_std::vector<IsoTree,_std::allocator<IsoTree>_>_*,_std::vector<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>_>
             ::operator*(local_50);
      local_40 = std::vector<IsoTree,_std::allocator<IsoTree>_>::size(this);
      write_bytes<unsigned_long>
                (in_stack_ffffffffffffff90._M_current,(size_t)in_stack_ffffffffffffff88._M_current,
                 (FILE **)in_stack_ffffffffffffff80);
      in_stack_ffffffffffffff90 =
           std::vector<IsoTree,_std::allocator<IsoTree>_>::begin(in_stack_ffffffffffffff78);
      in_stack_ffffffffffffff88 =
           std::vector<IsoTree,_std::allocator<IsoTree>_>::end(in_stack_ffffffffffffff78);
      while (bVar1 = __gnu_cxx::operator!=
                               ((__normal_iterator<const_IsoTree_*,_std::vector<IsoTree,_std::allocator<IsoTree>_>_>
                                 *)in_stack_ffffffffffffff80,
                                (__normal_iterator<const_IsoTree_*,_std::vector<IsoTree,_std::allocator<IsoTree>_>_>
                                 *)in_stack_ffffffffffffff78), bVar1) {
        in_stack_ffffffffffffff80 =
             __gnu_cxx::
             __normal_iterator<const_IsoTree_*,_std::vector<IsoTree,_std::allocator<IsoTree>_>_>::
             operator*((__normal_iterator<const_IsoTree_*,_std::vector<IsoTree,_std::allocator<IsoTree>_>_>
                        *)&stack0xffffffffffffff90);
        serialize_node<_IO_FILE*>(node_00,(_IO_FILE **)out_00);
        __gnu_cxx::
        __normal_iterator<const_IsoTree_*,_std::vector<IsoTree,_std::allocator<IsoTree>_>_>::
        operator++((__normal_iterator<const_IsoTree_*,_std::vector<IsoTree,_std::allocator<IsoTree>_>_>
                    *)&stack0xffffffffffffff90);
      }
      __gnu_cxx::
      __normal_iterator<const_std::vector<IsoTree,_std::allocator<IsoTree>_>_*,_std::vector<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>_>
      ::operator++(local_50);
    }
  }
  return;
}

Assistant:

void serialize_model(const IsoForest &model, otype &out)
{
    if (interrupt_switch) return;

    uint8_t data_en[] = {
        (uint8_t)model.new_cat_action,
        (uint8_t)model.cat_split_type,
        (uint8_t)model.missing_action,
        (uint8_t)model.has_range_penalty,
        (uint8_t)model.scoring_metric,
    };
    write_bytes<uint8_t>((void*)data_en, (size_t)5, out);

    double data_doubles[] = {
        model.exp_avg_depth,
        model.exp_avg_sep
    };
    write_bytes<double>((void*)data_doubles, (size_t)2, out);

    size_t data_sizets[] = {
        model.orig_sample_size,
        model.trees.size()
    };
    write_bytes<size_t>((void*)data_sizets, (size_t)2, out);

    size_t veclen;
    for (const auto &tree : model.trees) {
        veclen = tree.size();
        write_bytes<size_t>((void*)&veclen, (size_t)1, out);
        for (const auto &node : tree)
            serialize_node(node, out);
    }
}